

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7.c
# Opt level: O2

int get_signed_attribute(stack_st_X509_ATTRIBUTE *attribs,int nid,int type,char **buffer)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  void *__src;
  ASN1_TYPE *asn1_type;
  
  iVar1 = get_attribute(attribs,nid,&asn1_type);
  if (iVar1 == 0) {
    iVar1 = ASN1_TYPE_get((ASN1_TYPE *)asn1_type);
    if (iVar1 != type) {
      pcVar3 = "%s: wrong ASN.1 type\n";
LAB_0010c655:
      fprintf(_stderr,pcVar3,pname);
      exit(0x61);
    }
    uVar2 = ASN1_STRING_length((ASN1_STRING *)(asn1_type->value).asn1_string);
    if ((int)uVar2 < 1) {
      iVar1 = 1;
    }
    else {
      if (d_flag != 0) {
        printf("%s: allocating %d bytes for attribute\n",pname,(ulong)uVar2);
      }
      pcVar3 = (char *)malloc((ulong)((type == 0x13) + uVar2));
      *buffer = pcVar3;
      if (pcVar3 == (char *)0x0) {
        pcVar3 = "%s: cannot malloc space for attribute\n";
        goto LAB_0010c655;
      }
      __src = (void *)ASN1_STRING_get0_data((asn1_type->value).ptr);
      memcpy(pcVar3,__src,(ulong)uVar2);
      iVar1 = 0;
      if (type == 0x13) {
        (*buffer)[uVar2] = '\0';
      }
    }
  }
  else {
    iVar1 = 1;
    if (v_flag != 0) {
      fprintf(_stderr,"%s: error finding attribute\n",pname);
    }
  }
  return iVar1;
}

Assistant:

int get_signed_attribute(STACK_OF(X509_ATTRIBUTE) *attribs, int nid,int type, char **buffer){
	int		rc;
	ASN1_TYPE	*asn1_type;
	int		len;

	/* Find attribute */
	rc = get_attribute(attribs, nid, &asn1_type);
	if (rc == 1) {
		if (v_flag)
			fprintf(stderr, "%s: error finding attribute\n",pname);
		return (1);
	}
	if (ASN1_TYPE_get(asn1_type) != type) {
		fprintf(stderr, "%s: wrong ASN.1 type\n",pname);
		exit (SCEP_PKISTATUS_P7);
	}

	/* Copy data */
	len = ASN1_STRING_length(asn1_type->value.asn1_string);
	if (len <= 0) {
		return (1);
	} else if (d_flag)
		printf("%s: allocating %d bytes for attribute\n", pname, len);
	if (type == V_ASN1_PRINTABLESTRING) {
		*buffer = (char *)malloc(len + 1);
	} else {
		*buffer = (char *)malloc(len);
	}
	if (*buffer == NULL) {
		fprintf(stderr, "%s: cannot malloc space for attribute\n",
			pname);
		exit (SCEP_PKISTATUS_P7);
	}
/* for compatibility with older openssl versions
   from: https://wiki.openssl.org/index.php/OpenSSL_1.1.0_Changes

*/
#if OPENSSL_VERSION_NUMBER < 0x10100000L
	memcpy(*buffer, ASN1_STRING_data(asn1_type->value.asn1_string), len);
#else
	memcpy(*buffer, ASN1_STRING_get0_data(asn1_type->value.asn1_string), len);
#endif

	/* Add null terminator if it's a PrintableString */
	if (type == V_ASN1_PRINTABLESTRING) {
		(*buffer)[len] = 0;
		len++;
	}

	return (0);
}